

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O0

EStatusCode __thiscall
Type1Input::CalculateDependenciesForCharIndex
          (Type1Input *this,string *inCharStringName,CharString1Dependencies *ioDependenciesInfo)

{
  bool bVar1;
  Trace *this_00;
  pointer ppVar2;
  EStatusCode status;
  _Self local_78;
  iterator it;
  CharStringType1Interpreter interpreter;
  CharString1Dependencies *ioDependenciesInfo_local;
  string *inCharStringName_local;
  Type1Input *this_local;
  
  CharStringType1Interpreter::CharStringType1Interpreter((CharStringType1Interpreter *)&it);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>_>_>
       ::find(&this->mCharStrings,inCharStringName);
  _status = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>_>_>
            ::end(&this->mCharStrings);
  bVar1 = std::operator==(&local_78,(_Self *)&status);
  if (bVar1) {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "Type1Input::CalculateDependenciesForCharIndex, Exception, cannot find glyph from name"
                     );
    this_local._4_4_ = eFailure;
  }
  else {
    this->mCurrentDependencies = ioDependenciesInfo;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>_>
             ::operator->(&local_78);
    this_local._4_4_ =
         CharStringType1Interpreter::Intepret
                   ((CharStringType1Interpreter *)&it,&ppVar2->second,
                    (IType1InterpreterImplementation *)this);
    this->mCurrentDependencies = (CharString1Dependencies *)0x0;
  }
  CharStringType1Interpreter::~CharStringType1Interpreter((CharStringType1Interpreter *)&it);
  return this_local._4_4_;
}

Assistant:

EStatusCode Type1Input::CalculateDependenciesForCharIndex(const std::string& inCharStringName,
											  CharString1Dependencies& ioDependenciesInfo)
{
	CharStringType1Interpreter interpreter;
	StringToType1CharStringMap::iterator it = mCharStrings.find(inCharStringName);

	if(it == mCharStrings.end())
	{
		TRACE_LOG("Type1Input::CalculateDependenciesForCharIndex, Exception, cannot find glyph from name");
		return eFailure;
	}

	mCurrentDependencies = &ioDependenciesInfo;
	EStatusCode status = interpreter.Intepret(it->second,this);
	mCurrentDependencies = NULL;
	return status;
}